

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DWARFDie.cpp
# Opt level: O0

Optional<llvm::DWARFFormValue> * __thiscall
llvm::DWARFDie::find
          (Optional<llvm::DWARFFormValue> *__return_storage_ptr__,DWARFDie *this,
          ArrayRef<llvm::dwarf::Attribute> Attrs)

{
  Attribute Attr_00;
  bool bVar1;
  DWARFAbbreviationDeclaration *this_00;
  iterator pAVar2;
  uint64_t DIEOffset;
  Optional<llvm::DWARFFormValue> *Value;
  Attribute Attr;
  iterator __end2;
  iterator __begin2;
  ArrayRef<llvm::dwarf::Attribute> *__range2;
  DWARFAbbreviationDeclaration *AbbrevDecl;
  DWARFDie *this_local;
  ArrayRef<llvm::dwarf::Attribute> Attrs_local;
  
  Attrs_local.Data = (Attribute *)Attrs.Length;
  this_local = (DWARFDie *)Attrs.Data;
  bVar1 = isValid(this);
  if (bVar1) {
    this_00 = getAbbreviationDeclarationPtr(this);
    if (this_00 != (DWARFAbbreviationDeclaration *)0x0) {
      __end2 = ArrayRef<llvm::dwarf::Attribute>::begin
                         ((ArrayRef<llvm::dwarf::Attribute> *)&this_local);
      pAVar2 = ArrayRef<llvm::dwarf::Attribute>::end
                         ((ArrayRef<llvm::dwarf::Attribute> *)&this_local);
      for (; __end2 != pAVar2; __end2 = __end2 + 1) {
        Attr_00 = *__end2;
        DIEOffset = getOffset(this);
        DWARFAbbreviationDeclaration::getAttributeValue
                  (__return_storage_ptr__,this_00,DIEOffset,Attr_00,this->U);
        bVar1 = llvm::Optional::operator_cast_to_bool((Optional *)__return_storage_ptr__);
        if (bVar1) {
          return __return_storage_ptr__;
        }
      }
    }
    Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
  }
  else {
    Optional<llvm::DWARFFormValue>::Optional(__return_storage_ptr__,None);
  }
  return __return_storage_ptr__;
}

Assistant:

Optional<DWARFFormValue>
DWARFDie::find(ArrayRef<dwarf::Attribute> Attrs) const {
  if (!isValid())
    return None;
  auto AbbrevDecl = getAbbreviationDeclarationPtr();
  if (AbbrevDecl) {
    for (auto Attr : Attrs) {
      if (auto Value = AbbrevDecl->getAttributeValue(getOffset(), Attr, *U))
        return Value;
    }
  }
  return None;
}